

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O0

bool __thiscall TCLAP::SwitchArg::lastCombined(SwitchArg *this,string *combinedSwitches)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  uint local_24;
  uint i;
  string *combinedSwitches_local;
  SwitchArg *this_local;
  
  local_24 = 1;
  while( true ) {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= local_24) {
      return true;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)combinedSwitches);
    cVar1 = *pcVar4;
    cVar2 = Arg::blankChar();
    if (cVar1 != cVar2) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

inline bool SwitchArg::lastCombined(std::string& combinedSwitches ) 
{
  for ( unsigned int i = 1; i < combinedSwitches.length(); i++ )
    if ( combinedSwitches[i] != Arg::blankChar() )
      return false;
        
  return true;
}